

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O3

void __thiscall t_st_generator::generate_force_consts(t_st_generator *this)

{
  ostream *poVar1;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  class_name_abi_cxx11_(&local_48,this);
  prefix(&local_c8,this,&local_48);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," enums keysAndValuesDo: [:k :v | ",0x21);
  class_name_abi_cxx11_(&local_88,this);
  prefix(&local_e8,this,&local_88);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_e8._M_dataplus._M_p,local_e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," enums at: k put: v value].!",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  class_name_abi_cxx11_(&local_68,this);
  prefix(&local_c8,this,&local_68);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," constants keysAndValuesDo: [:k :v | ",0x25);
  class_name_abi_cxx11_(&local_a8,this);
  prefix(&local_e8,this,&local_a8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_e8._M_dataplus._M_p,local_e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," constants at: k put: v value].!",0x20)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_st_generator::generate_force_consts() {
  f_ << prefix(class_name()) << " enums keysAndValuesDo: [:k :v | " << prefix(class_name())
     << " enums at: k put: v value].!" << endl;

  f_ << prefix(class_name()) << " constants keysAndValuesDo: [:k :v | " << prefix(class_name())
     << " constants at: k put: v value].!" << endl;
}